

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

parser_error parse_profile_tunnel(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"rnd");
    *(wchar_t *)((long)pvVar3 + 0x38) = wVar1;
    wVar1 = parser_getint(p,"chg");
    *(wchar_t *)((long)pvVar3 + 0x3c) = wVar1;
    wVar1 = parser_getint(p,"con");
    *(wchar_t *)((long)pvVar3 + 0x40) = wVar1;
    wVar1 = parser_getint(p,"pen");
    *(wchar_t *)((long)pvVar3 + 0x44) = wVar1;
    wVar1 = parser_getint(p,"jct");
    *(wchar_t *)((long)pvVar3 + 0x48) = wVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_profile_tunnel(struct parser *p) {
	struct cave_profile *c = parser_priv(p);

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	c->tun.rnd = parser_getint(p, "rnd");
	c->tun.chg = parser_getint(p, "chg");
	c->tun.con = parser_getint(p, "con");
	c->tun.pen = parser_getint(p, "pen");
	c->tun.jct = parser_getint(p, "jct");
	return PARSE_ERROR_NONE;
}